

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalNinjaGenerator::CheckCxxModuleSupport(cmGlobalNinjaGenerator *this)

{
  cmake *pcVar1;
  bool bVar2;
  ostream *poVar3;
  string local_1b8;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_198;
  ostringstream e;
  
  if ((this->DiagnosedCxxModuleSupport == false) &&
     (bVar2 = cmake::GetIsInTryCompile
                        ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance
                        ), !bVar2)) {
    this->DiagnosedCxxModuleSupport = true;
    pcVar1 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,
               "C++20 modules support via CMAKE_EXPERIMENTAL_CXX_MODULE_DYNDEP is experimental.  It is meant only for compiler developers to try."
               ,(allocator<char> *)&local_198);
    local_1b8._M_dataplus._M_p = (pointer)0x0;
    local_1b8._M_string_length = 0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_1b8);
    cmake::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)&e,(cmListFileBacktrace *)&local_1b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1b8._M_string_length);
    std::__cxx11::string::~string((string *)&e);
    if (this->NinjaSupportsDyndeps != false) {
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar3 = std::operator<<((ostream *)&e,
                             "The Ninja generator does not support C++20 modules using Ninja version \n  "
                            );
    poVar3 = std::operator<<(poVar3,(string *)&this->NinjaVersion);
    poVar3 = std::operator<<(poVar3,"\ndue to lack of required features.  Ninja ");
    RequiredNinjaVersionForDyndeps_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,(string *)&local_1b8);
    std::operator<<(poVar3," or higher is required.");
    std::__cxx11::string::~string((string *)&local_1b8);
    pcVar1 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
    std::__cxx11::stringbuf::str();
    local_198.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_198.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_198);
    cmake::IssueMessage(pcVar1,FATAL_ERROR,&local_1b8,(cmListFileBacktrace *)&local_198);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_198.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)&local_1b8);
    cmSystemTools::s_FatalErrorOccurred = true;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    return false;
  }
  return this->NinjaSupportsDyndeps;
}

Assistant:

bool cmGlobalNinjaGenerator::CheckCxxModuleSupport()
{
  bool const diagnose = !this->DiagnosedCxxModuleSupport &&
    !this->CMakeInstance->GetIsInTryCompile();
  if (diagnose) {
    this->DiagnosedCxxModuleSupport = true;
    this->GetCMakeInstance()->IssueMessage(
      MessageType::AUTHOR_WARNING,
      "C++20 modules support via CMAKE_EXPERIMENTAL_CXX_MODULE_DYNDEP "
      "is experimental.  It is meant only for compiler developers to try.");
  }
  if (this->NinjaSupportsDyndeps) {
    return true;
  }
  if (diagnose) {
    std::ostringstream e;
    /* clang-format off */
    e <<
      "The Ninja generator does not support C++20 modules "
      "using Ninja version \n"
      "  " << this->NinjaVersion << "\n"
      "due to lack of required features.  "
      "Ninja " << RequiredNinjaVersionForDyndeps() << " or higher is required."
      ;
    /* clang-format on */
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccurred();
  }
  return false;
}